

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O0

void __thiscall Model::Initialize(Model *this)

{
  bool *pbVar1;
  size_t *this_00;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  ostream *this_01;
  reference psVar5;
  element_type *peVar6;
  double *pdVar7;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *pmVar8;
  reference ppVar9;
  reference psVar10;
  element_type *this_02;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
  *pmVar11;
  reference ppVar12;
  reference pPVar13;
  string *psVar14;
  size_type sVar15;
  mapped_type *pmVar16;
  SpeciesTracker *pSVar17;
  shared_ptr<Reaction> local_708;
  shared_ptr<Reaction> local_6f8;
  shared_ptr<Reaction> local_6e8;
  SpeciesTracker *local_6d8;
  SpeciesTracker *tracker_4;
  shared_ptr<BindPolymerase> reaction_3;
  Polymerase pol_template_1;
  double rate_constant_1;
  Polymerase pol_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<Polymerase,_std::allocator<Polymerase>_> *__range4_1;
  _Self local_598;
  undefined1 local_590 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
  rbs_name;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
  *__range2_1;
  Ptr transcript;
  iterator __end1_1;
  iterator __begin1_1;
  VecPtr *__range1_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rbs_names;
  shared_ptr<Reaction> local_4c0;
  SpeciesTracker *local_4b0;
  SpeciesTracker *tracker_3;
  shared_ptr<BindRnase> reaction_2;
  Rnase rnase_template_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  rnase_site;
  const_iterator __end4;
  const_iterator __begin4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *__range4;
  shared_ptr<Reaction> local_3c8;
  allocator local_3b1;
  string local_3b0;
  SpeciesTracker *local_390;
  SpeciesTracker *tracker_2;
  shared_ptr<BindRnase> reaction_1;
  Rnase rnase_template;
  shared_ptr<Reaction> local_2e8;
  allocator local_2d1;
  string local_2d0;
  SpeciesTracker *local_2b0;
  SpeciesTracker *tracker_1;
  shared_ptr<BindRnase> reaction_ext;
  Rnase rnase_template_ext;
  shared_ptr<Reaction> local_208;
  shared_ptr<Reaction> local_1f8;
  SpeciesTracker *local_1e8;
  SpeciesTracker *tracker;
  shared_ptr<BindPolymerase> reaction;
  Polymerase pol_template;
  double rate_constant;
  Polymerase pol;
  iterator __end3;
  iterator __begin3;
  vector<Polymerase,_std::allocator<Polymerase>_> *__range3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
  promoter_name;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
  *__range2;
  Ptr genome;
  iterator __end1;
  iterator __begin1;
  VecPtr *__range1;
  Model *this_local;
  
  sVar4 = std::vector<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>::size
                    (&this->genomes_);
  if ((sVar4 == 0) &&
     (sVar4 = std::
              vector<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>::
              size(&this->transcripts_), sVar4 == 0)) {
    this_01 = std::operator<<((ostream *)&std::cerr,
                              "Warning: There are no Genome objects registered with Model. Did you forget to register a Genome?"
                             );
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  __end1 = std::vector<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>::begin
                     (&this->genomes_);
  genome.super___shared_ptr<Genome,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::vector<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>::end
                 (&this->genomes_);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<Genome>_*,_std::vector<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>_>
                                     *)&genome.
                                        super___shared_ptr<Genome,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_refcount), bVar2) {
    psVar5 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<Genome>_*,_std::vector<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<Genome>::shared_ptr((shared_ptr<Genome> *)&__range2,psVar5);
    peVar6 = std::__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &__range2);
    pmVar11 = Genome::bindings_abi_cxx11_(peVar6);
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
             ::begin(pmVar11);
    promoter_name.second._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
                 ::end(pmVar11);
    while (bVar2 = std::operator!=(&__end2,(_Self *)&promoter_name.second._M_t._M_impl.
                                                     super__Rb_tree_header._M_node_count), bVar2) {
      ppVar12 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>
                ::operator*(&__end2);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
              *)&__range3,ppVar12);
      __end3 = std::vector<Polymerase,_std::allocator<Polymerase>_>::begin(&this->polymerases_);
      pol.super_MobileElement._120_8_ =
           std::vector<Polymerase,_std::allocator<Polymerase>_>::end(&this->polymerases_);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<Polymerase_*,_std::vector<Polymerase,_std::allocator<Polymerase>_>_>
                                         *)&pol.super_MobileElement.polymerasereadthrough_), bVar2)
      {
        pPVar13 = __gnu_cxx::
                  __normal_iterator<Polymerase_*,_std::vector<Polymerase,_std::allocator<Polymerase>_>_>
                  ::operator*(&__end3);
        Polymerase::Polymerase((Polymerase *)&rate_constant,pPVar13);
        psVar14 = MobileElement::name_abi_cxx11_((MobileElement *)&rate_constant);
        sVar15 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                          *)((long)&promoter_name.first.field_2 + 8),psVar14);
        if (sVar15 != 0) {
          psVar14 = MobileElement::name_abi_cxx11_((MobileElement *)&rate_constant);
          pmVar16 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                  *)((long)&promoter_name.first.field_2 + 8),psVar14);
          pol_template.super_MobileElement._120_8_ = *pmVar16;
          Polymerase::Polymerase
                    ((Polymerase *)
                     &reaction.super___shared_ptr<BindPolymerase,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,(Polymerase *)&rate_constant);
          std::make_shared<BindPolymerase,double&,double&,std::__cxx11::string_const&,Polymerase&>
                    ((double *)&tracker,
                     (double *)&pol_template.super_MobileElement.polymerasereadthrough_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &this->cell_volume_,(Polymerase *)&__range3);
          pSVar17 = SpeciesTracker::Instance();
          local_1e8 = pSVar17;
          std::shared_ptr<Reaction>::shared_ptr<BindPolymerase,void>
                    (&local_1f8,(shared_ptr<BindPolymerase> *)&tracker);
          SpeciesTracker::Add(pSVar17,(string *)&__range3,&local_1f8);
          std::shared_ptr<Reaction>::~shared_ptr(&local_1f8);
          pSVar17 = local_1e8;
          psVar14 = MobileElement::name_abi_cxx11_((MobileElement *)&rate_constant);
          std::shared_ptr<Reaction>::shared_ptr<BindPolymerase,void>
                    (&local_208,(shared_ptr<BindPolymerase> *)&tracker);
          SpeciesTracker::Add(pSVar17,psVar14,&local_208);
          std::shared_ptr<Reaction>::~shared_ptr(&local_208);
          pbVar1 = &rnase_template_ext.super_MobileElement.polymerasereadthrough_;
          std::shared_ptr<Reaction>::shared_ptr<BindPolymerase,void>
                    ((shared_ptr<Reaction> *)pbVar1,(shared_ptr<BindPolymerase> *)&tracker);
          Gillespie::LinkReaction(&this->gillespie_,(Ptr *)pbVar1);
          std::shared_ptr<Reaction>::~shared_ptr
                    ((shared_ptr<Reaction> *)
                     &rnase_template_ext.super_MobileElement.polymerasereadthrough_);
          std::shared_ptr<BindPolymerase>::~shared_ptr((shared_ptr<BindPolymerase> *)&tracker);
          Polymerase::~Polymerase
                    ((Polymerase *)
                     &reaction.super___shared_ptr<BindPolymerase,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        Polymerase::~Polymerase((Polymerase *)&rate_constant);
        __gnu_cxx::
        __normal_iterator<Polymerase_*,_std::vector<Polymerase,_std::allocator<Polymerase>_>_>::
        operator++(&__end3);
      }
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
               *)&__range3);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>
      ::operator++(&__end2);
    }
    peVar6 = std::__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &__range2);
    pdVar7 = Genome::transcript_degradation_rate_ext(peVar6);
    if ((*pdVar7 != 0.0) || (NAN(*pdVar7))) {
      peVar6 = std::__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &__range2);
      iVar3 = Genome::rnase_footprint(peVar6);
      peVar6 = std::__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &__range2);
      pdVar7 = Genome::rnase_speed(peVar6);
      Rnase::Rnase((Rnase *)&reaction_ext.super___shared_ptr<BindRnase,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,iVar3,*pdVar7);
      peVar6 = std::__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &__range2);
      pdVar7 = Genome::transcript_degradation_rate_ext(peVar6);
      std::make_shared<BindRnase,double_const&,double&,Rnase&,char_const(&)[17]>
                ((double *)&tracker_1,pdVar7,(Rnase *)&this->cell_volume_,
                 (char (*) [17])
                 &reaction_ext.super___shared_ptr<BindRnase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
      pSVar17 = SpeciesTracker::Instance();
      local_2b0 = pSVar17;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2d0,"__rnase_site_ext",&local_2d1);
      std::shared_ptr<Reaction>::shared_ptr<BindRnase,void>
                (&local_2e8,(shared_ptr<BindRnase> *)&tracker_1);
      SpeciesTracker::Add(pSVar17,&local_2d0,&local_2e8);
      std::shared_ptr<Reaction>::~shared_ptr(&local_2e8);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
      pbVar1 = &rnase_template.super_MobileElement.polymerasereadthrough_;
      std::shared_ptr<Reaction>::shared_ptr<BindRnase,void>
                ((shared_ptr<Reaction> *)pbVar1,(shared_ptr<BindRnase> *)&tracker_1);
      Gillespie::LinkReaction(&this->gillespie_,(Ptr *)pbVar1);
      std::shared_ptr<Reaction>::~shared_ptr
                ((shared_ptr<Reaction> *)&rnase_template.super_MobileElement.polymerasereadthrough_)
      ;
      std::shared_ptr<BindRnase>::~shared_ptr((shared_ptr<BindRnase> *)&tracker_1);
      Rnase::~Rnase((Rnase *)&reaction_ext.super___shared_ptr<BindRnase,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount);
    }
    peVar6 = std::__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &__range2);
    pdVar7 = Genome::transcript_degradation_rate(peVar6);
    if ((*pdVar7 != 0.0) || (NAN(*pdVar7))) {
      peVar6 = std::__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &__range2);
      iVar3 = Genome::rnase_footprint(peVar6);
      peVar6 = std::__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &__range2);
      pdVar7 = Genome::rnase_speed(peVar6);
      Rnase::Rnase((Rnase *)&reaction_1.super___shared_ptr<BindRnase,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,iVar3,*pdVar7);
      peVar6 = std::__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &__range2);
      pdVar7 = Genome::transcript_degradation_rate(peVar6);
      std::make_shared<BindRnase,double_const&,double&,Rnase&,char_const(&)[13]>
                ((double *)&tracker_2,pdVar7,(Rnase *)&this->cell_volume_,
                 (char (*) [13])
                 &reaction_1.super___shared_ptr<BindRnase,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      pSVar17 = SpeciesTracker::Instance();
      local_390 = pSVar17;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3b0,"__rnase_site",&local_3b1);
      std::shared_ptr<Reaction>::shared_ptr<BindRnase,void>
                (&local_3c8,(shared_ptr<BindRnase> *)&tracker_2);
      SpeciesTracker::Add(pSVar17,&local_3b0,&local_3c8);
      std::shared_ptr<Reaction>::~shared_ptr(&local_3c8);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
      std::shared_ptr<Reaction>::shared_ptr<BindRnase,void>
                ((shared_ptr<Reaction> *)&__range4,(shared_ptr<BindRnase> *)&tracker_2);
      Gillespie::LinkReaction(&this->gillespie_,(shared_ptr<Reaction> *)&__range4);
      std::shared_ptr<Reaction>::~shared_ptr((shared_ptr<Reaction> *)&__range4);
      std::shared_ptr<BindRnase>::~shared_ptr((shared_ptr<BindRnase> *)&tracker_2);
      Rnase::~Rnase((Rnase *)&reaction_1.super___shared_ptr<BindRnase,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
    }
    else {
      peVar6 = std::__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &__range2);
      pmVar8 = Genome::rnase_bindings_abi_cxx11_(peVar6);
      sVar15 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::size(pmVar8);
      if (sVar15 != 0) {
        peVar6 = std::__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                            )&__range2);
        pmVar8 = Genome::rnase_bindings_abi_cxx11_(peVar6);
        __end4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 ::begin(pmVar8);
        rnase_site.second =
             (double)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                     ::end(pmVar8);
        while (bVar2 = std::operator!=(&__end4,(_Self *)&rnase_site.second), bVar2) {
          ppVar9 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
                   ::operator*(&__end4);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
          ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                  *)&rnase_template_1.super_MobileElement.polymerasereadthrough_,ppVar9);
          peVar6 = std::__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&__range2);
          iVar3 = Genome::rnase_footprint(peVar6);
          peVar6 = std::__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Genome,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&__range2);
          pdVar7 = Genome::rnase_speed(peVar6);
          Rnase::Rnase((Rnase *)&reaction_2.
                                 super___shared_ptr<BindRnase,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount,iVar3,*pdVar7);
          std::make_shared<BindRnase,double&,double&,Rnase&,std::__cxx11::string_const&>
                    ((double *)&tracker_3,(double *)((long)&rnase_site.first.field_2 + 8),
                     (Rnase *)&this->cell_volume_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &reaction_2.super___shared_ptr<BindRnase,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          pSVar17 = SpeciesTracker::Instance();
          local_4b0 = pSVar17;
          std::shared_ptr<Reaction>::shared_ptr<BindRnase,void>
                    (&local_4c0,(shared_ptr<BindRnase> *)&tracker_3);
          SpeciesTracker::Add(pSVar17,(string *)
                                      &rnase_template_1.super_MobileElement.polymerasereadthrough_,
                              &local_4c0);
          std::shared_ptr<Reaction>::~shared_ptr(&local_4c0);
          this_00 = &rbs_names._M_t._M_impl.super__Rb_tree_header._M_node_count;
          std::shared_ptr<Reaction>::shared_ptr<BindRnase,void>
                    ((shared_ptr<Reaction> *)this_00,(shared_ptr<BindRnase> *)&tracker_3);
          Gillespie::LinkReaction(&this->gillespie_,(Ptr *)this_00);
          std::shared_ptr<Reaction>::~shared_ptr
                    ((shared_ptr<Reaction> *)
                     &rbs_names._M_t._M_impl.super__Rb_tree_header._M_node_count);
          std::shared_ptr<BindRnase>::~shared_ptr((shared_ptr<BindRnase> *)&tracker_3);
          Rnase::~Rnase((Rnase *)&reaction_2.
                                  super___shared_ptr<BindRnase,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
          std::
          pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
          ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                   *)&rnase_template_1.super_MobileElement.polymerasereadthrough_);
          std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>
          ::operator++(&__end4);
        }
      }
    }
    std::shared_ptr<Genome>::~shared_ptr((shared_ptr<Genome> *)&__range2);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Genome>_*,_std::vector<std::shared_ptr<Genome>,_std::allocator<std::shared_ptr<Genome>_>_>_>
    ::operator++(&__end1);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&__range1_1);
  __end1_1 = std::vector<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>
             ::begin(&this->transcripts_);
  transcript.super___shared_ptr<Transcript,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::vector<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>::end
                 (&this->transcripts_);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::shared_ptr<Transcript>_*,_std::vector<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>_>
                             *)&transcript.
                                super___shared_ptr<Transcript,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount), bVar2) {
    psVar10 = __gnu_cxx::
              __normal_iterator<std::shared_ptr<Transcript>_*,_std::vector<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>_>
              ::operator*(&__end1_1);
    std::shared_ptr<Transcript>::shared_ptr((shared_ptr<Transcript> *)&__range2_1,psVar10);
    this_02 = std::__shared_ptr_access<Transcript,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<Transcript,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&__range2_1);
    pmVar11 = Transcript::bindings_abi_cxx11_(this_02);
    __end2_1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
               ::begin(pmVar11);
    rbs_name.second._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>_>
                 ::end(pmVar11);
    while (bVar2 = std::operator!=(&__end2_1,
                                   (_Self *)&rbs_name.second._M_t._M_impl.super__Rb_tree_header.
                                             _M_node_count), bVar2) {
      ppVar12 = std::
                _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>
                ::operator*(&__end2_1);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
              *)local_590,ppVar12);
      local_598._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1_1,(key_type *)local_590);
      __range4_1 = (vector<Polymerase,_std::allocator<Polymerase>_> *)
                   std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range1_1);
      bVar2 = std::operator==(&local_598,(_Self *)&__range4_1);
      if (bVar2) {
        __end4_1 = std::vector<Polymerase,_std::allocator<Polymerase>_>::begin(&this->polymerases_);
        pol_1.super_MobileElement._120_8_ =
             std::vector<Polymerase,_std::allocator<Polymerase>_>::end(&this->polymerases_);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end4_1,
                                  (__normal_iterator<Polymerase_*,_std::vector<Polymerase,_std::allocator<Polymerase>_>_>
                                   *)&pol_1.super_MobileElement.polymerasereadthrough_), bVar2) {
          pPVar13 = __gnu_cxx::
                    __normal_iterator<Polymerase_*,_std::vector<Polymerase,_std::allocator<Polymerase>_>_>
                    ::operator*(&__end4_1);
          Polymerase::Polymerase((Polymerase *)&rate_constant_1,pPVar13);
          psVar14 = MobileElement::name_abi_cxx11_((MobileElement *)&rate_constant_1);
          sVar15 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                            *)((long)&rbs_name.first.field_2 + 8),psVar14);
          if (sVar15 != 0) {
            psVar14 = MobileElement::name_abi_cxx11_((MobileElement *)&rate_constant_1);
            pmVar16 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                                    *)((long)&rbs_name.first.field_2 + 8),psVar14);
            pol_template_1.super_MobileElement._120_8_ = *pmVar16;
            Polymerase::Polymerase
                      ((Polymerase *)
                       &reaction_3.super___shared_ptr<BindPolymerase,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,(Polymerase *)&rate_constant_1);
            std::make_shared<BindPolymerase,double&,double&,std::__cxx11::string_const&,Polymerase&>
                      ((double *)&tracker_4,
                       (double *)&pol_template_1.super_MobileElement.polymerasereadthrough_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &this->cell_volume_,(Polymerase *)local_590);
            pSVar17 = SpeciesTracker::Instance();
            local_6d8 = pSVar17;
            std::shared_ptr<Reaction>::shared_ptr<BindPolymerase,void>
                      (&local_6e8,(shared_ptr<BindPolymerase> *)&tracker_4);
            SpeciesTracker::Add(pSVar17,(string *)local_590,&local_6e8);
            std::shared_ptr<Reaction>::~shared_ptr(&local_6e8);
            pSVar17 = local_6d8;
            psVar14 = MobileElement::name_abi_cxx11_((MobileElement *)&rate_constant_1);
            std::shared_ptr<Reaction>::shared_ptr<BindPolymerase,void>
                      (&local_6f8,(shared_ptr<BindPolymerase> *)&tracker_4);
            SpeciesTracker::Add(pSVar17,psVar14,&local_6f8);
            std::shared_ptr<Reaction>::~shared_ptr(&local_6f8);
            std::shared_ptr<Reaction>::shared_ptr<BindPolymerase,void>
                      (&local_708,(shared_ptr<BindPolymerase> *)&tracker_4);
            Gillespie::LinkReaction(&this->gillespie_,&local_708);
            std::shared_ptr<Reaction>::~shared_ptr(&local_708);
            std::shared_ptr<BindPolymerase>::~shared_ptr((shared_ptr<BindPolymerase> *)&tracker_4);
            Polymerase::~Polymerase
                      ((Polymerase *)
                       &reaction_3.super___shared_ptr<BindPolymerase,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          Polymerase::~Polymerase((Polymerase *)&rate_constant_1);
          __gnu_cxx::
          __normal_iterator<Polymerase_*,_std::vector<Polymerase,_std::allocator<Polymerase>_>_>::
          operator++(&__end4_1);
        }
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range1_1,(value_type *)local_590);
      }
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>
               *)local_590);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_>_>
      ::operator++(&__end2_1);
    }
    std::shared_ptr<Transcript>::~shared_ptr((shared_ptr<Transcript> *)&__range2_1);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Transcript>_*,_std::vector<std::shared_ptr<Transcript>,_std::allocator<std::shared_ptr<Transcript>_>_>_>
    ::operator++(&__end1_1);
  }
  this->initialized_ = true;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&__range1_1);
  return;
}

Assistant:

void Model::Initialize() {
  if (genomes_.size() == 0 && transcripts_.size() == 0) {
    std::cerr << "Warning: There are no Genome objects registered with "
                 "Model. Did you forget to register a Genome?"
              << std::endl;
  }
  // Create Bind reactions for each promoter-polymerase pair
  for (Genome::Ptr genome : genomes_) {
    for (auto promoter_name : genome->bindings()) {
      for (auto pol : polymerases_) {
        if (promoter_name.second.count(pol.name()) != 0) {
          double rate_constant = promoter_name.second[pol.name()];
          Polymerase pol_template = Polymerase(pol);
          auto reaction = std::make_shared<BindPolymerase>(
              rate_constant, cell_volume_, promoter_name.first, pol_template);
          auto &tracker = SpeciesTracker::Instance();
          tracker.Add(promoter_name.first, reaction);
          tracker.Add(pol.name(), reaction);
          gillespie_.LinkReaction(reaction);
        }
      }
    }
    // Create reaction for external rnase binding
    if (genome->transcript_degradation_rate_ext() != 0.0) {
      auto rnase_template_ext =
          Rnase(genome->rnase_footprint(), genome->rnase_speed());
      auto reaction_ext = std::make_shared<BindRnase>(
          genome->transcript_degradation_rate_ext(), cell_volume_,
          rnase_template_ext, "__rnase_site_ext");
      auto &tracker = SpeciesTracker::Instance();
      tracker.Add("__rnase_site_ext", reaction_ext);
      gillespie_.LinkReaction(reaction_ext);
    }
    
    // Create reaction for internal rnase binding
    if (genome->transcript_degradation_rate() != 0.0) {
      // TODO: user defined Rnase speed
      // auto rnase_template = Rnase(10, 30);
      auto rnase_template =
          Rnase(genome->rnase_footprint(), genome->rnase_speed());
      auto reaction = std::make_shared<BindRnase>(
          genome->transcript_degradation_rate(), cell_volume_, rnase_template,
          "__rnase_site");
      auto &tracker = SpeciesTracker::Instance();
      tracker.Add("__rnase_site", reaction);
      gillespie_.LinkReaction(reaction);
    } 
    
    // Alternatively, create bind reactions for individual rnase sites
    else if (genome->rnase_bindings().size() != 0) {
      for (auto rnase_site : genome->rnase_bindings()) {
        auto rnase_template =
          Rnase(genome->rnase_footprint(), genome->rnase_speed());
        auto reaction = std::make_shared<BindRnase>(
          rnase_site.second, cell_volume_, rnase_template, rnase_site.first);
        auto &tracker = SpeciesTracker::Instance();
        tracker.Add(rnase_site.first, reaction);
        gillespie_.LinkReaction(reaction);
      }
    }
  }
  
  // Initialize transcripts that have been defined independently of genome
  std::set <std::string> rbs_names;
  for (Transcript::Ptr transcript : transcripts_) {
    for (auto rbs_name : transcript->bindings()) {
      if (rbs_names.find(rbs_name.first) == rbs_names.end()) { // only make reactions for unique RBS sites
        for (auto pol : polymerases_) {
          if (rbs_name.second.count(pol.name()) != 0) {
            double rate_constant = rbs_name.second[pol.name()];
            Polymerase pol_template = Polymerase(pol);
            auto reaction = std::make_shared<BindPolymerase>(
                rate_constant, cell_volume_, rbs_name.first, pol_template);
            auto &tracker = SpeciesTracker::Instance();
            tracker.Add(rbs_name.first, reaction);
            tracker.Add(pol.name(), reaction);
            gillespie_.LinkReaction(reaction);
          }
        }
        rbs_names.insert(rbs_name.first);
      }
    }
  }

  initialized_ = true;
}